

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

ArrayBuilder<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> * __thiscall
kj::ArrayBuilder<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry>::
operator=(ArrayBuilder<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry>
          *this,ArrayBuilder<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> *other)

{
  RemoveConst<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> *pRVar1;
  ArrayDisposer *pAVar2;
  
  dispose(this);
  pRVar1 = other->pos;
  *(Entry **)this = other->ptr;
  *(RemoveConst<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> **)(this + 8) = pRVar1;
  pAVar2 = other->disposer;
  *(Entry **)(this + 0x10) = other->endPtr;
  *(ArrayDisposer **)(this + 0x18) = pAVar2;
  other->ptr = (Entry *)0x0;
  other->pos = (RemoveConst<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> *)0x0;
  other->endPtr = (Entry *)0x0;
  return (ArrayBuilder<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> *)this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }